

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
mxx::all2allv<char>(vector<char,_std::allocator<char>_> *__return_storage_ptr__,char *msgs,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *msgs_00;
  unsigned_long __n;
  reference out;
  allocator_type local_4a;
  undefined1 local_49;
  unsigned_long *local_48;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  unsigned_long local_38;
  size_t recv_size;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes_local;
  char *msgs_local;
  vector<char,_std::allocator<char>_> *result;
  
  recv_size = (size_t)comm;
  comm_local = (comm *)recv_sizes;
  recv_sizes_local = send_sizes;
  send_sizes_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)msgs;
  msgs_local = (char *)__return_storage_ptr__;
  local_40._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(recv_sizes);
  local_48 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local);
  __n = std::
        accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                  (local_40,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_48,0);
  local_49 = 0;
  local_38 = __n;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,__n,&local_4a);
  std::allocator<char>::~allocator(&local_4a);
  msgs_00 = send_sizes_local;
  send_sizes_00 = recv_sizes_local;
  out = std::vector<char,_std::allocator<char>_>::operator[](__return_storage_ptr__,0);
  all2allv<char>((char *)msgs_00,send_sizes_00,out,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)comm_local,
                 (comm *)recv_size);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2allv(const T* msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t recv_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), static_cast<size_t>(0));
    std::vector<T> result(recv_size);
    all2allv(msgs, send_sizes, &result[0], recv_sizes, comm);
    return result;
}